

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA>::eval_exc_vxc_unpolar_impl
               (double rho,double *eps,double *vrho)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  double __x_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar1 = cbrt(rho);
  dVar1 = 1.0 / dVar1;
  dVar14 = dVar1 * 2.4814019635975995;
  dVar7 = SQRT(dVar14);
  dVar3 = dVar7;
  dVar2 = dVar7;
  if (dVar14 < 0.0) {
    dVar2 = sqrt(dVar14);
    dVar3 = sqrt(dVar14);
  }
  dVar3 = dVar3 * dVar3 * dVar3;
  dVar10 = dVar1 * 1.720508027656199;
  dVar13 = dVar14 * 0.25;
  dVar16 = dVar10 * 0.30820873317469316 * 0.25 + 1.0;
  dVar19 = dVar13 * dVar13 * 0.49294;
  dVar20 = dVar3 * 0.204775 + dVar10 * 5.1742145584348584 * 0.25 + dVar2 * 7.5957 * 0.5 + dVar19;
  dVar18 = dVar13 * dVar13 * 0.49671;
  dVar15 = dVar3 * 0.1100325 + dVar10 * 5.225414418180771 * 0.25 + dVar2 * 10.357 * 0.5 + dVar18;
  dVar3 = (dVar10 * 0.16045026469669918 * 0.25 + 1.0) * 0.0;
  __x_00 = (59.217149286433354 / dVar15) * 0.5 + 1.0;
  dVar1 = dVar1 / rho;
  dVar10 = dVar1 * 1.720508027656199;
  auVar17._0_8_ = (1.0 / dVar2) * 7.5957 * -1.4422495703074083 * dVar10;
  auVar17._8_8_ = dVar10 * 5.1742145584348584;
  auVar17 = divpd(auVar17,_DAT_010417c0);
  __x = (32.16364864430221 / dVar20) * 0.5 + 1.0;
  dVar13 = log(__x);
  dVar4 = dVar16 * 0.031091 * dVar13;
  dVar5 = log(__x_00);
  dVar6 = dVar3 * dVar5 * 0.5848223397455204;
  if (dVar14 < 0.0) {
    dVar7 = sqrt(dVar14);
  }
  auVar9._8_8_ = __x;
  auVar9._0_8_ = dVar20 * dVar20;
  auVar11 = divpd(_DAT_01041040,auVar9);
  dVar14 = (dVar6 + dVar6) - (dVar4 + dVar4);
  auVar8._0_8_ = dVar13 * dVar1 * 0.016486798667810512;
  auVar8._8_8_ = dVar5 * dVar1 * 0.0 * 0.5848223397455204;
  auVar12._0_8_ = dVar10 * (1.0 / dVar2) * 10.357 * -1.4422495703074083;
  auVar12._8_8_ = dVar10 * 5.225414418180771;
  auVar12 = divpd(auVar12,_DAT_010417c0);
  auVar9 = divpd(auVar8,_DAT_01041800);
  *eps = dVar14;
  *vrho = rho * (((((dVar7 * 1.6382 * 1.4422495703074083 * -0.0625 * dVar10 +
                    (auVar17._0_8_ - auVar17._8_8_)) - ((dVar19 + dVar19) * (1.0 / rho)) / 3.0) *
                   auVar11._8_8_ * dVar16 * auVar11._0_8_ + auVar9._0_8_) - auVar9._8_8_) -
                (1.0 / (dVar15 * dVar15)) * dVar3 *
                ((dVar7 * 0.88026 * 1.4422495703074083 * -0.0625 * dVar10 +
                 (auVar12._0_8_ - auVar12._8_8_)) - ((dVar18 + dVar18) * (1.0 / rho)) / 3.0) *
                (1.0 / __x_00) * 0.5848223397455204) + dVar14;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double& eps, double& vrho ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t52 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t17 = 0.1e1 / t1;
    constexpr double t18 = beta1_0;
    constexpr double t19 = t3 * t6;
    constexpr double t26 = beta2_0 * t3;
    constexpr double t29 = beta3_0;
    constexpr double t36 = pp_0 + 0.1e1;
    constexpr double t57 = a_2;
    constexpr double t59 = alpha1_2;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = 0.1e1 / t57;
    constexpr double t65 = beta1_2;
    constexpr double t69 = beta2_2 * t3;
    constexpr double t72 = beta3_2;
    constexpr double t77 = pp_2 + 0.1e1;
    constexpr double t87 = 0.1e1 / fz20;
    constexpr double t94 = t1 * t2 * t3;


    const double t10 = safe_math::cbrt( rho );
    const double t11 = 0.1e1 / t10;
    const double t12 = t9 * t11;
    const double t15 = 0.1e1 + t4 * t12 / 0.4e1;
    const double t21 = t19 * t8 * t11;
    const double t22 = safe_math::sqrt( t21 );
    const double t30 = pow_3_2( t21 );
    const double t34 = t21 / 0.4e1;
    const double t37 = safe_math::pow( t34, t36 );
    const double t38 = beta4_0 * t37;
    const double t39 = t18 * t22 / 0.2e1 + t26 * t12 / 0.4e1 + 0.125e0 * t29 * t30 + t38;
    const double t43 = 0.1e1 + t17 / t39 / 0.2e1;
    const double t44 = safe_math::log( t43 );
    const double t45 = t1 * t15 * t44;
    const double t47 = safe_math::cbrt( zeta_tol );
    const double t49 = piecewise_functor_3( 0.1e1 <= zeta_tol, t47 * zeta_tol, 1.0 );
    const double t56 = ( 0.2e1 * t49 - 0.2e1 ) / ( 0.2e1 * t52 - 0.2e1 );
    const double t63 = 0.1e1 + t60 * t12 / 0.4e1;
    const double t78 = safe_math::pow( t34, t77 );
    const double t79 = beta4_2 * t78;
    const double t80 = t65 * t22 / 0.2e1 + t69 * t12 / 0.4e1 + 0.125e0 * t72 * t30 + t79;
    const double t84 = 0.1e1 + t64 / t80 / 0.2e1;
    const double t85 = safe_math::log( t84 );
    const double t89 = t56 * t57 * t63 * t85 * t87;
    const double t96 = 0.1e1 / t10 / rho;
    const double t99 = t94 * t9 * t96 * t44;
    const double t101 = t39 * t39;
    const double t102 = 0.1e1 / t101;
    const double t103 = t15 * t102;
    const double t104 = 0.1e1 / t22;
    const double t106 = t18 * t104 * t3;
    const double t107 = t9 * t96;
    const double t112 = safe_math::sqrt( t21 );
    const double t114 = t29 * t112 * t3;
    const double t117 = 0.1e1 / rho;
    const double t121 = -t106 * t107 / 0.12e2 - t26 * t107 / 0.12e2 - 0.625e-1 * t114 * t107 - t38 * t36 * t117 / 0.3e1;
    const double t122 = 0.1e1 / t43;
    const double t123 = t121 * t122;
    const double t124 = t103 * t123;
    const double t127 = t56 * t57 * t59 * t3;
    const double t131 = t127 * t9 * t96 * t85 * t87;
    const double t133 = t56 * t63;
    const double t134 = t80 * t80;
    const double t135 = 0.1e1 / t134;
    const double t137 = t65 * t104 * t3;
    const double t143 = t72 * t112 * t3;
    const double t149 = -t137 * t107 / 0.12e2 - t69 * t107 / 0.12e2 - 0.625e-1 * t143 * t107 - t79 * t77 * t117 / 0.3e1;
    const double t151 = 0.1e1 / t84;
    const double t152 = t151 * t87;
    const double t154 = t133 * t135 * t149 * t152;


    eps = -0.2e1 * t45 + 0.2e1 * t89;
    vrho = -0.2e1 * t45 + 0.2e1 * t89 + rho * ( t99 / 0.6e1 + t124 - t131 / 0.6e1 - t154 );

  }